

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O2

void findScaleSpaceExtrema
               (vector<extrema,_std::allocator<extrema>_> *KP,
               vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
               *dogScaleSpace,Mat *image,uint *cnt)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uchar *puVar8;
  size_t sVar9;
  bool bVar10;
  long lVar11;
  ostream *poVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  pointer pvVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  double dVar34;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar36;
  undefined4 extraout_XMM0_Db_00;
  __m128 t;
  undefined1 auVar35 [16];
  double dVar37;
  undefined1 auVar38 [16];
  float fVar39;
  pair<double,_int> pVar40;
  float local_248;
  float fStack_244;
  uint local_1f8;
  uint local_1f4;
  float local_1f0;
  uint local_1ec;
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  Matx31f dD2;
  Vec3f dD;
  vector<double,_std::allocator<double>_> tmpCell;
  double local_128;
  Point2f local_120;
  Vec3f X;
  double val;
  extrema local_100;
  Vec<float,_3> local_8c;
  float fStack_80;
  float fStack_7c;
  float fStack_78;
  undefined8 local_74;
  float local_6c;
  double local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  _Vector_base<double,_std::allocator<double>_> local_48;
  ulong uVar25;
  
  lVar19 = 0;
  do {
    local_1ec = (uint)lVar19;
    if (lVar19 == 4) {
      return;
    }
    pvVar21 = (dogScaleSpace->
              super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = *(long *)&pvVar21[lVar19].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                       .super__Vector_impl_data;
    dVar34 = (double)(int)local_1ec;
    uVar25 = 1;
    while (fVar24 = (float)uVar25,
          uVar25 < ((long)*(pointer *)
                           ((long)&pvVar21[lVar19].
                                   super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                                   super__Vector_impl_data + 8) - lVar13) / 0x60 - 1U) {
      lVar31 = uVar25 * 0x60;
      local_1d0 = (ulong)((int)fVar24 - 1) * 0x60;
      local_1d8 = (ulong)((int)fVar24 + 1) * 0x60;
      local_1f0 = fVar24;
      local_1f4 = 5;
      while (uVar25 = (ulong)((int)fVar24 + 1), local_1f4 < *(int *)(lVar13 + 8 + lVar31) - 5U) {
        lVar16 = (long)(int)local_1f4;
        local_68 = (double)local_1f4;
        uVar14 = local_1f4 + 1;
        lVar17 = (long)(int)uVar14;
        lVar11 = (long)(int)(local_1f4 - 1);
        for (uVar15 = 5; uVar15 < *(int *)(lVar13 + 0xc + lVar31) - 5U; uVar15 = uVar15 + 1) {
          *cnt = *cnt + 1;
          local_1e8 = (double)(long)(int)uVar15;
          val = (double)*(byte *)((long)local_1e8 +
                                 **(long **)(lVar13 + lVar31 + 0x48) * lVar16 +
                                 *(long *)(lVar13 + lVar31 + 0x10));
          local_100.octave = 9.0;
          local_1f8 = uVar15;
          bVar10 = findExtrema(dogScaleSpace,&val,&local_1ec,(uint *)&local_1f0,&local_1f4,
                               &local_1f8,&local_100.octave);
          lVar13 = (long)local_1e8;
          if (bVar10) {
            local_100.NeighborCells.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_100.NeighborCells.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_100.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_100.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_100.NeighborCells.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_100.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_100.cell_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_100.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_100.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            lVar4 = *(long *)&pvVar21[lVar19].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data;
            auVar35._0_8_ = (double)uVar15;
            auVar35._8_8_ = local_68;
            uVar2 = *(undefined8 *)(lVar4 + 8 + lVar31);
            auVar38._0_8_ = (double)(int)uVar2;
            auVar38._8_8_ = (double)(int)((ulong)uVar2 >> 0x20);
            auVar35 = divpd(auVar35,auVar38);
            uVar1 = image->rows;
            uVar3 = image->cols;
            local_100.pt.x = (float)((double)(int)uVar1 * auVar35._0_8_);
            local_100.pt.y = (float)((double)(int)uVar3 * auVar35._8_8_);
            lVar23 = *(long *)(lVar4 + 0x10 + lVar31);
            lVar5 = **(long **)(lVar4 + 0x48 + lVar31);
            lVar29 = lVar5 * lVar16 + lVar23;
            local_1c8 = (long)(int)(uVar15 + 1);
            lVar18 = (long)(int)(uVar15 - 1);
            lVar26 = lVar5 * lVar17 + lVar23;
            lVar23 = lVar5 * lVar11 + lVar23;
            lVar5 = *(long *)(lVar4 + 0x10 + local_1d8);
            lVar6 = **(long **)(lVar4 + 0x48 + local_1d8);
            lVar27 = lVar6 * lVar16 + lVar5;
            lVar22 = *(long *)(lVar4 + 0x10 + local_1d0);
            lVar7 = **(long **)(lVar4 + 0x48 + local_1d0);
            lVar28 = lVar7 * lVar16 + lVar22;
            dD.super_Matx<float,_3,_1>.val[0] =
                 (float)(int)((uint)*(byte *)(local_1c8 + lVar29) - (uint)*(byte *)(lVar18 + lVar29)
                             ) * 0.0019607844;
            dD.super_Matx<float,_3,_1>.val[1] =
                 (float)(int)((uint)*(byte *)((long)local_1e8 + lVar26) -
                             (uint)*(byte *)((long)local_1e8 + lVar23)) * 0.0019607844;
            dD.super_Matx<float,_3,_1>.val[2] =
                 (float)(int)((uint)*(byte *)((long)local_1e8 + lVar27) -
                             (uint)*(byte *)((long)local_1e8 + lVar28)) * 0.0019607844;
            fVar32 = (float)*(byte *)((long)local_1e8 + lVar29) +
                     (float)*(byte *)((long)local_1e8 + lVar29);
            fVar39 = ((float)((uint)*(byte *)(lVar18 + lVar29) + (uint)*(byte *)(local_1c8 + lVar29)
                             ) - fVar32) * 0.003921569;
            local_6c = ((float)((uint)*(byte *)((long)local_1e8 + lVar28) +
                               (uint)*(byte *)((long)local_1e8 + lVar27)) - fVar32) * 0.003921569;
            local_8c.super_Matx<float,_3,_1>.val[2] =
                 (float)(int)((uint)*(byte *)(lVar18 + lVar28) +
                             ((uint)*(byte *)(local_1c8 + lVar27) -
                             ((uint)*(byte *)(local_1c8 + lVar28) + (uint)*(byte *)(lVar18 + lVar27)
                             ))) * 0.0009803922;
            local_8c.super_Matx<float,_3,_1>.val[1] =
                 (float)(int)((uint)*(byte *)(lVar18 + lVar23) +
                             ((uint)*(byte *)(local_1c8 + lVar26) -
                             ((uint)*(byte *)(local_1c8 + lVar23) + (uint)*(byte *)(lVar18 + lVar26)
                             ))) * 0.0009803922;
            fVar32 = ((float)((uint)*(byte *)((long)local_1e8 + lVar23) +
                             (uint)*(byte *)((long)local_1e8 + lVar26)) - fVar32) * 0.003921569;
            fStack_78 = (float)(int)((uint)*(byte *)((long)local_1e8 + lVar7 * lVar11 + lVar22) +
                                    ((uint)*(byte *)((long)local_1e8 + lVar6 * lVar17 + lVar5) -
                                    ((uint)*(byte *)((long)local_1e8 + lVar7 * lVar17 + lVar22) +
                                    (uint)*(byte *)((long)local_1e8 + lVar6 * lVar11 + lVar5)))) *
                        0.0009803922;
            local_74 = CONCAT44(fStack_78,local_8c.super_Matx<float,_3,_1>.val[2]);
            local_100.octave = dVar34;
            local_100.layer = (int)fVar24;
            local_8c.super_Matx<float,_3,_1>.val[0] = fVar39;
            fStack_80 = local_8c.super_Matx<float,_3,_1>.val[1];
            fStack_7c = fVar32;
            local_58 = local_8c.super_Matx<float,_3,_1>.val[1];
            fStack_54 = local_8c.super_Matx<float,_3,_1>.val[1];
            fStack_50 = local_8c.super_Matx<float,_3,_1>.val[1];
            fStack_4c = local_8c.super_Matx<float,_3,_1>.val[1];
            cv::Matx<float,_3,_3>::solve((Matx<float,_3,_3> *)&X,&local_8c,(int)&dD);
            if (((0.5 <= ABS(X.super_Matx<float,_3,_1>.val[2])) ||
                (0.5 <= ABS(X.super_Matx<float,_3,_1>.val[1]))) ||
               (0.5 <= ABS(X.super_Matx<float,_3,_1>.val[0]))) {
              lVar23 = lVar4 + lVar31;
              lVar5 = *(long *)(lVar23 + 0x10);
              lVar6 = **(long **)(lVar23 + 0x48);
              lVar22 = lVar6 * lVar16 + lVar5;
              dD2.val[0] = (float)(int)((uint)*(byte *)(local_1c8 + lVar22) -
                                       (uint)*(byte *)(lVar18 + lVar22)) * 0.0019607844;
              dD2.val[1] = (float)(int)((uint)*(byte *)(lVar13 + lVar6 * lVar17 + lVar5) -
                                       (uint)*(byte *)(lVar13 + lVar6 * lVar11 + lVar5)) *
                           0.0019607844;
              dD2.val[2] = (float)(int)((uint)*(byte *)(lVar13 + **(long **)(lVar4 + local_1d8 +
                                                                            0x48) * lVar16 +
                                                                 *(long *)(lVar4 + local_1d8 + 0x10)
                                                       ) -
                                       (uint)*(byte *)(lVar13 + **(long **)(local_1d0 + lVar4 + 0x48
                                                                           ) * lVar16 +
                                                                *(long *)(local_1d0 + lVar4 + 0x10))
                                       ) * 0.0019607844;
              local_248 = -X.super_Matx<float,_3,_1>.val[0];
              fStack_244 = -X.super_Matx<float,_3,_1>.val[1];
              tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)(X.super_Matx<float,_3,_1>.val._0_8_ ^ 0x8000000080000000);
              tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)(CONCAT44(tmpCell.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                      X.super_Matx<float,_3,_1>.val[2]) ^ 0x80000000);
              fVar33 = cv::Matx<float,_3,_1>::dot
                                 (&dD2,(Matx<float,_3,_1> *)
                                       &tmpCell.super__Vector_base<double,_std::allocator<double>_>)
              ;
              fVar33 = ABS((float)*(byte *)(lVar13 + **(long **)(lVar23 + 0x48) * lVar16 +
                                                     *(long *)(lVar23 + 0x10)) * 0.003921569 +
                           fVar33 * 0.5) * 5.0;
              if (0.03 <= fVar33) {
                poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar33);
                std::endl<char,std::char_traits<char>>(poVar12);
                fVar33 = fVar39 * fVar32 - local_58 * local_58;
                if ((0.0 < fVar33) &&
                   ((fVar39 + fVar32) * (fVar39 + fVar32) * 10.0 < fVar33 * 121.0)) {
                  fVar32 = local_100.pt.y;
                  local_100.pt.x = local_100.pt.x + (float)(int)ROUND(local_248);
                  local_100.pt.y = fVar32 + (float)(int)ROUND(fStack_244);
                  std::vector<double,_std::allocator<double>_>::resize(&local_100.keypoint_bin,0x24)
                  ;
                  std::vector<double,_std::allocator<double>_>::resize(&local_100.cell_bin,8);
                  puVar8 = image->data;
                  sVar9 = *(image->step).p;
                  local_1e8 = (double)puVar8[(long)(int)(local_100.pt.x + 1.0) +
                                             (long)(int)local_100.pt.y * sVar9] -
                              (double)puVar8[(long)(int)(local_100.pt.x + -1.0) +
                                             (long)(int)local_100.pt.y * sVar9];
                  dVar37 = (double)puVar8[(long)(int)local_100.pt.x +
                                          (long)(int)(local_100.pt.y + 1.0) * sVar9] -
                           (double)puVar8[(long)(int)local_100.pt.x +
                                          (long)(int)(local_100.pt.y + -1.0) * sVar9];
                  local_100.angle = calAngle(local_1e8,dVar37);
                  local_100.magnitude = pow(local_1e8 * local_1e8 + dVar37 * dVar37,0.5);
                  dVar37 = exp2((double)(local_100.layer + -1) * 0.5 + local_100.octave);
                  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar37 * 1.5);
                  keypoint_Orientation
                            ((vector<double,_std::allocator<double>_> *)
                             &tmpCell.super__Vector_base<double,_std::allocator<double>_>,image,
                             &local_100.pt,(double *)&local_48);
                  std::vector<double,_std::allocator<double>_>::_M_move_assign
                            (&local_100.keypoint_bin,
                             &tmpCell.super__Vector_base<double,_std::allocator<double>_>);
                  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                            (&tmpCell.super__Vector_base<double,_std::allocator<double>_>);
                  uVar36 = extraout_XMM0_Db;
                  for (iVar20 = 0; iVar20 != 4; iVar20 = iVar20 + 1) {
                    local_1e8 = (double)CONCAT44(uVar36,(float)(iVar20 * 4));
                    uStack_1e0 = 0;
                    for (iVar30 = 0; iVar30 != 0x10; iVar30 = iVar30 + 4) {
                      tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_120.x = local_100.pt.x + (float)iVar30 + -7.0;
                      local_120.y = local_100.pt.y + (float)local_1e8 + -7.0;
                      pVar40 = Max(&local_100.keypoint_bin);
                      local_128 = (double)(pVar40.second * 10);
                      calcOrientationHist((vector<double,_std::allocator<double>_> *)&local_48,image
                                          ,&local_120,&local_100.pt,&local_128);
                      std::vector<double,_std::allocator<double>_>::_M_move_assign
                                ((vector<double,_std::allocator<double>_> *)
                                 &tmpCell.super__Vector_base<double,_std::allocator<double>_>,
                                 &local_48);
                      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
                      std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::push_back(&local_100.NeighborCells,
                                  (value_type *)
                                  &tmpCell.super__Vector_base<double,_std::allocator<double>_>);
                      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                                (&tmpCell.super__Vector_base<double,_std::allocator<double>_>);
                      uVar36 = extraout_XMM0_Db_00;
                    }
                  }
                  std::vector<extrema,_std::allocator<extrema>_>::push_back(KP,&local_100);
                  extrema::~extrema(&local_100);
                  pvVar21 = (dogScaleSpace->
                            super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  goto LAB_00107016;
                }
              }
            }
            extrema::~extrema(&local_100);
            pvVar21 = (dogScaleSpace->
                      super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            break;
          }
LAB_00107016:
          lVar13 = *(long *)&pvVar21[lVar19].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                             _M_impl.super__Vector_impl_data;
        }
        lVar13 = *(long *)&pvVar21[lVar19].super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                           _M_impl.super__Vector_impl_data;
        local_1f4 = uVar14;
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

void findScaleSpaceExtrema(vector<extrema>& KP, const vector<vector<Mat> >& dogScaleSpace, const Mat& image, unsigned& cnt){
    for(unsigned i = 0; i < octave; i++){
        for(unsigned j = 1; j < dogScaleSpace[i].size()-1; j++){
            for(unsigned r = border; r < dogScaleSpace[i][j].rows-border; r++){
                for(unsigned c = border; c < dogScaleSpace[i][j].cols-border; c++){
                    cnt ++;
                    double val = (double)dogScaleSpace[i][j].at<uchar>(r,c);
                    if( findExtrema(dogScaleSpace, val, i, j, r, c, thres)){
                        extrema tmpKp;
                        double tangentR, tangentC, angle;
                        tmpKp.octave = i;
                        tmpKp.layer = j;
                        const Mat& img = dogScaleSpace[i][j];
                        // tmpKp.pt.y = r / (double)img.cols * (double)image.cols;
                        // tmpKp.pt.x = c / (double)img.rows * (double)image.rows;
                        tmpKp.pt = Point2f (c / (double)img.rows * (double)image.rows, r / (double)img.cols * (double)image.cols);

////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
                        const float img_scale = 1.f/(255);
                        const float deriv_scale = img_scale*0.5f;
                        const float second_deriv_scale = img_scale;
                        const float cross_deriv_scale = img_scale*0.25f;

                        const Mat& prev = dogScaleSpace[i][j-1];
                        const Mat& next = dogScaleSpace[i][j+1];
                        float xi, xr, xc, contr;

                        Vec3f dD((img.at<uchar>(r, c+1) - img.at<uchar>(r, c-1))*deriv_scale,
                                (img.at<uchar>(r+1, c) - img.at<uchar>(r-1, c))*deriv_scale,
                                (next.at<uchar>(r, c) - prev.at<uchar>(r, c))*deriv_scale);
                        
                        float v2 = (float)img.at<uchar>(r, c)*2;
                        float dxx = (img.at<uchar>(r, c+1) + img.at<uchar>(r, c-1) - v2)*second_deriv_scale;
                        float dyy = (img.at<uchar>(r+1, c) + img.at<uchar>(r-1, c) - v2)*second_deriv_scale;
                        float dss = (next.at<uchar>(r, c) + prev.at<uchar>(r, c) - v2)*second_deriv_scale;
                        float dxy = (img.at<uchar>(r+1, c+1) - img.at<uchar>(r+1, c-1) -
                                    img.at<uchar>(r-1, c+1) + img.at<uchar>(r-1, c-1))*cross_deriv_scale;
                        float dxs = (next.at<uchar>(r, c+1) - next.at<uchar>(r, c-1) -
                                    prev.at<uchar>(r, c+1) + prev.at<uchar>(r, c-1))*cross_deriv_scale;
                        float dys = (next.at<uchar>(r+1, c) - next.at<uchar>(r-1, c) -
                                    prev.at<uchar>(r+1, c) + prev.at<uchar>(r-1, c))*cross_deriv_scale;
                        
                        Matx33f H(dxx, dxy, dxs,
                                  dxy, dyy, dys,
                                  dxs, dys, dss);

                        Vec3f X = H.solve(dD, DECOMP_LU);

                        xi = -X[2];
                        xr = -X[1];
                        xc = -X[0];

                        if( std::abs(xi) < 0.5f && std::abs(xr) < 0.5f && std::abs(xc) < 0.5f )
                            break;
                        
                        Matx31f dD2((img.at<uchar>(r, c+1) - img.at<uchar>(r, c-1))*deriv_scale,
                                   (img.at<uchar>(r+1, c) - img.at<uchar>(r-1, c))*deriv_scale,
                                   (next.at<uchar>(r, c) - prev.at<uchar>(r, c))*deriv_scale);
                        float t = dD2.dot(Matx31f(xc, xr, xi));
                        contr = img.at<uchar>(r,c)*img_scale + t*0.5f;
                        if( abs( contr ) * octaveLayer < 0.03 )
                            break;
                        cout << abs( contr ) * octaveLayer << endl;
                        
                        double edgeThreshold = 10.0;
                        float tr = dxx + dyy;
                        float det = dxx * dyy - dxy * dxy;
                        if( det <= 0 || tr*tr*edgeThreshold >= (edgeThreshold + 1)*(edgeThreshold + 1)*det )
                            break;

                        // cout << xi << "  "<< xr << "  "<< xc <<endl;
                        // if(std::abs(xi) > 1 || std::abs(xr) > 1 || std::abs(xc) < 1)
                        //     break;
                        tmpKp.pt.x += cvRound(xc);
                        tmpKp.pt.y += cvRound(xr);
////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
                        tmpKp.keypoint_bin.resize(36);
                        tmpKp.cell_bin.resize(8);
                        tangentC = (double)image.at<uchar>(tmpKp.pt.y, tmpKp.pt.x+1) - (double)image.at<uchar>(tmpKp.pt.y, tmpKp.pt.x-1);
                        tangentR = (double)image.at<uchar>(tmpKp.pt.y+1, tmpKp.pt.x) - (double)image.at<uchar>(tmpKp.pt.y-1, tmpKp.pt.x);
                        angle = calAngle(tangentC, tangentR);
                        tmpKp.angle = angle;
                        tmpKp.magnitude = pow(tangentC * tangentC + tangentR * tangentR, 0.5);
                        tmpKp.keypoint_bin = keypoint_Orientation(image, tmpKp.pt, 1.5 * pow(2,(tmpKp.layer-1)/2.0 + tmpKp.octave));

                        for(unsigned row_cell = 0; row_cell < block_width; row_cell++){
                            for(unsigned col_cell = 0; col_cell < block_width; col_cell++){
                                vector<double> tmpCell;
                                tmpCell = calcOrientationHist(image, Point2f(tmpKp.pt.x + col_cell*block_width - 7, tmpKp.pt.y + row_cell*block_width - 7),
                                                                tmpKp.pt, Max(tmpKp.keypoint_bin).second * 10);
                                tmpKp.NeighborCells.push_back(tmpCell);
                            }
                        }
                        KP.push_back(tmpKp);
                    }
                }
            }
        }
    }
}